

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntfs-part.c
# Opt level: O3

ntfs_part * ntfs_open_part(hd_context *ctx,hd_disk *disk,char *partname)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  ntfs_part *pnVar3;
  uchar *buf;
  ntfs_part *part;
  ntfs_part *local_28;
  
  local_28 = (ntfs_part *)0x0;
  hd_var_imp(&local_28);
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      iVar2 = hd_open_dev(ctx,partname);
      pnVar3 = (ntfs_part *)hd_new_disk_of_size(ctx,0x878);
      (pnVar3->super).drop_part = ntfs_drop_part_imp;
      (pnVar3->super).probe_part = ntfs_probe_label;
      (pnVar3->super).clone_part = ntfs_part_clone;
      (pnVar3->super).scan_buffer_size = 0x10000;
      buf = (uchar *)hd_malloc(ctx,0x10000);
      (pnVar3->super).scan_buffer = buf;
      (pnVar3->super).dev_fd = iVar2;
      local_28 = pnVar3;
      hd_read_write_device(ctx,iVar2,false,buf,0,(ulong)(disk->sector_size << 3));
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    return local_28;
  }
  hd_drop_part(ctx,&local_28->super);
  hd_rethrow(ctx);
}

Assistant:

ntfs_part *
ntfs_open_part (hd_context *ctx, hd_disk *disk, const char *partname)
{
    ntfs_part *part = NULL;

    int dev_fd;
    hd_var(part);

    hd_try(ctx)
    {
        dev_fd = hd_open_dev(ctx, partname);
        part = ntfs_new_part(ctx, dev_fd);
        hd_read_write_device(ctx, part->super.dev_fd, false, part->super.scan_buffer, 0, 8 * disk->sector_size);

    }
    hd_catch(ctx)
    {
        hd_drop_part(ctx, &part->super);
        hd_rethrow(ctx);
    }
    return part;
}